

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adj_matrix_graph.c
# Opt level: O1

MatrixGraph createUDG(Vertices vertex,Edges edge,int countOfVertex,int countOfEdge)

{
  VertexType *pVVar1;
  int **ppiVar2;
  MatrixGraph pAVar3;
  ulong uVar4;
  long lVar5;
  
  if (0 < countOfVertex) {
    pAVar3 = newEmptyMatrixGraph(countOfVertex,countOfEdge);
    pAVar3->kind = UDG;
    pVVar1 = pAVar3->vertex;
    uVar4 = 0;
    do {
      pVVar1[uVar4] = vertex[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uint)countOfVertex != uVar4);
    if (0 < countOfEdge) {
      ppiVar2 = pAVar3->matrix;
      lVar5 = 0;
      do {
        ppiVar2[*(int *)((long)&edge->vi + lVar5)][*(int *)((long)&edge->vj + lVar5)] = 1;
        ppiVar2[*(int *)((long)&edge->vj + lVar5)][*(int *)((long)&edge->vi + lVar5)] = 1;
        lVar5 = lVar5 + 0xc;
      } while ((ulong)(uint)countOfEdge * 0xc != lVar5);
    }
    return pAVar3;
  }
  return (MatrixGraph)0x0;
}

Assistant:

MatrixGraph createUDG(Vertices vertex, Edges edge, int countOfVertex, int countOfEdge) {
    if (countOfVertex <= 0) return NULL;
    MatrixGraph matrixGraph = newEmptyMatrixGraph(countOfVertex, countOfEdge);
    matrixGraph->kind = UDG;
    putVertexIntoMatrix(matrixGraph, vertex, countOfVertex);

    // 构建矩阵
    for (int i = 0; i < countOfEdge; ++i) {
        matrixGraph->matrix[edge[i].vi][edge[i].vj] = 1;
        matrixGraph->matrix[edge[i].vj][edge[i].vi] = 1;
    }

    return matrixGraph;
}